

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CollectorOutput.cpp
# Opt level: O2

void __thiscall
Test::CollectorOutput::finishSuite
          (CollectorOutput *this,string *suiteName,uint numTests,uint numPositiveTests,
          microseconds totalDuration)

{
  SuiteInfo *pSVar1;
  runtime_error *this_00;
  undefined4 in_register_00000014;
  
  pSVar1 = this->currentSuite;
  if (pSVar1 != (SuiteInfo *)0x0) {
    pSVar1->numPositiveTests = numPositiveTests;
    (pSVar1->suiteDuration).__r = totalDuration.__r;
    return;
  }
  this_00 = (runtime_error *)
            __cxa_allocate_exception(0x10,suiteName,CONCAT44(in_register_00000014,numTests));
  std::runtime_error::runtime_error(this_00,"Invalid Suite!");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void CollectorOutput::finishSuite(const std::string &suiteName, const unsigned int numTests,
    const unsigned int numPositiveTests, const std::chrono::microseconds totalDuration) {
  if (currentSuite == nullptr)
    throw std::runtime_error("Invalid Suite!");
  currentSuite->numPositiveTests = numPositiveTests;
  currentSuite->suiteDuration = totalDuration;
}